

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O1

ostream * std::operator<<(ostream *os,quath *v)

{
  float fVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  fVar1 = tinyusdz::value::half_to_float((half)(v->real).value);
  std::ostream::_M_insert<double>((double)fVar1);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  fVar1 = tinyusdz::value::half_to_float((half)(v->imag)._M_elems[0].value);
  std::ostream::_M_insert<double>((double)fVar1);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  fVar1 = tinyusdz::value::half_to_float((half)(v->imag)._M_elems[1].value);
  std::ostream::_M_insert<double>((double)fVar1);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  fVar1 = tinyusdz::value::half_to_float((half)(v->imag)._M_elems[2].value);
  std::ostream::_M_insert<double>((double)fVar1);
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::quath &v) {
  os << "(" << v.real << ", " << v.imag[0] << ", " << v.imag[1] << ", "
     << v.imag[2] << ")";
  return os;
}